

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall soplex::SPxBasisBase<double>::factorize(SPxBasisBase<double> *this)

{
  int iVar1;
  undefined8 *puVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  this->updateCount = 0;
  iVar1 = (*this->factor->_vptr_SLinSolver[5])
                    (this->factor,(this->matrix).data,(ulong)(uint)(this->matrix).thesize);
  if (iVar1 == 2) {
    if (this->thestatus != SINGULAR) {
      this->thestatus = SINGULAR;
    }
    this->factorized = false;
  }
  else {
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"EBASIS08 error: unknown status of factorization.\n",0x31);
      this->factorized = false;
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"XBASIS01 This should never happen.","");
      *puVar2 = &PTR__SPxException_0069d438;
      puVar2[1] = puVar2 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_40,local_40 + local_38)
      ;
      *puVar2 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar2,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if (this->thestatus == SINGULAR) {
      this->thestatus = REGULAR;
    }
    this->factorized = true;
    (*this->factor->_vptr_SLinSolver[6])();
    dVar3 = (double)(~-(ulong)(0.0001 < extraout_XMM0_Qa) & (ulong)extraout_XMM0_Qa |
                    (ulong)(extraout_XMM0_Qa * 0.001) & -(ulong)(0.0001 < extraout_XMM0_Qa));
    dVar3 = (double)(~-(ulong)(1e-05 < dVar3) & (ulong)dVar3 |
                    (ulong)(dVar3 * 0.01) & -(ulong)(1e-05 < dVar3));
    this->minStab = dVar3;
    if (1e-06 < dVar3) {
      this->minStab = dVar3 * 0.1;
    }
  }
  iVar1 = (*this->factor->_vptr_SLinSolver[3])();
  this->lastMem = iVar1;
  if (this->nzCount < 1) {
    dVar3 = 1.0;
  }
  else {
    dVar3 = (double)this->nzCount;
  }
  this->lastFill = ((double)iVar1 * this->fillFactor) / dVar3;
  this->lastNzCount = (int)(dVar3 * this->nonzeroFactor);
  if (this->thestatus != SINGULAR) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot factorize singular matrix","");
  *puVar2 = &PTR__SPxException_0069d438;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_40,local_40 + local_38);
  *puVar2 = &PTR__SPxException_0069d650;
  __cxa_throw(puVar2,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

void SPxBasisBase<R>::factorize()
{

   assert(factor != nullptr);

   if(!matrixIsSetup)
      loadDesc(thedesc);

   assert(matrixIsSetup);

   updateCount = 0;

   switch(factor->load(matrix.get_ptr(), matrix.size()))
   {
   case SLinSolver<R>::OK :
      if(status() == SINGULAR)
         setStatus(REGULAR);

      factorized = true;
      minStab = factor->stability();

      // This seems always to be about 1e-7
      if(minStab > 1e-4)
         minStab *= 0.001;

      if(minStab > 1e-5)
         minStab *= 0.01;

      if(minStab > 1e-6)
         minStab *= 0.1;

      break;

   case SLinSolver<R>::SINGULAR :
      setStatus(SINGULAR);
      factorized = false;
      break;

   default :
      SPX_MSG_ERROR(std::cerr << "EBASIS08 error: unknown status of factorization.\n";)
      factorized = false;
      throw SPxInternalCodeException("XBASIS01 This should never happen.");
   }

   // get nonzero count of factorization
   lastMem    = factor->memory();
   // compute fill ratio between factorization and basis matrix (multiplied with tolerance)
   lastFill   = fillFactor * R(lastMem) / R(nzCount > 0 ? nzCount : 1);
   lastNzCount = int(nonzeroFactor * R(nzCount > 0 ? nzCount : 1));

   if(status() == SINGULAR)
   {
      throw SPxStatusException("Cannot factorize singular matrix");
   }
}